

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_setRoot(char *archive,char *subdir)

{
  DirHandle *pDVar1;
  int iVar2;
  size_t sVar3;
  char *dst;
  DirHandle **ppDVar4;
  ulong uVar5;
  
  if (archive == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
LAB_00107a48:
    iVar2 = 0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    ppDVar4 = &searchPath;
    while (pDVar1 = *ppDVar4, pDVar1 != (DirHandle *)0x0) {
      if (pDVar1->dirName != (char *)0x0) {
        iVar2 = strcmp(archive,pDVar1->dirName);
        if (iVar2 == 0) {
          if ((subdir == (char *)0x0) || ((*subdir == '/' && (subdir[1] == '\0')))) {
            if (pDVar1->root != (char *)0x0) {
              (*__PHYSFS_AllocatorHooks.Free)(pDVar1->root);
            }
            pDVar1->root = (char *)0x0;
            pDVar1->rootlen = 0;
            break;
          }
          sVar3 = strlen(subdir);
          uVar5 = sVar3 + 1;
          dst = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(uVar5);
          if (dst == (char *)0x0) {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          }
          else {
            iVar2 = sanitizePlatformIndependentPath(subdir,dst);
            if (iVar2 != 0) {
              if (pDVar1->root != (char *)0x0) {
                (*__PHYSFS_AllocatorHooks.Free)(pDVar1->root);
              }
              pDVar1->root = dst;
              pDVar1->rootlen = uVar5;
              if (longest_root < uVar5) {
                longest_root = uVar5;
              }
              break;
            }
            (*__PHYSFS_AllocatorHooks.Free)(dst);
          }
          __PHYSFS_platformReleaseMutex(stateLock);
          goto LAB_00107a48;
        }
      }
      ppDVar4 = &pDVar1->next;
    }
    __PHYSFS_platformReleaseMutex(stateLock);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int PHYSFS_setRoot(const char *archive, const char *subdir)
{
    DirHandle *i;

    BAIL_IF(!archive, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    for (i = searchPath; i != NULL; i = i->next)
    {
        if ((i->dirName != NULL) && (strcmp(archive, i->dirName) == 0))
        {
            if (!subdir || (strcmp(subdir, "/") == 0))
            {
                if (i->root)
                    allocator.Free(i->root);
                i->root = NULL;
                i->rootlen = 0;
            } /* if */
            else
            {
                const size_t len = strlen(subdir) + 1;
                char *ptr = (char *) allocator.Malloc(len);
                BAIL_IF_MUTEX(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
                if (!sanitizePlatformIndependentPath(subdir, ptr))
                {
                    allocator.Free(ptr);
                    BAIL_MUTEX_ERRPASS(stateLock, 0);
                } /* if */

                if (i->root)
                    allocator.Free(i->root);
                i->root = ptr;
                i->rootlen = len;

                if (longest_root < len)
                    longest_root = len;
            } /* else */

            break;
        } /* if */
    } /* for */

    __PHYSFS_platformReleaseMutex(stateLock);
    return 1;
}